

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall
cs::instance_type::check_define_var(instance_type *this,iterator it,bool regist,bool constant)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  token_base *ptVar3;
  int iVar4;
  token_base **pptVar5;
  iterator it_00;
  internal_error *piVar6;
  runtime_error *prVar7;
  tree_type<cs::token_base_*> *t;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  allocator local_61;
  string local_60;
  iterator it_local;
  size_t local_38;
  
  it_local = it;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  if (*pptVar5 == (token_base *)0x0) {
    piVar6 = (internal_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_60,"Null pointer accessed.",&local_61);
    internal_error::internal_error(piVar6,&local_60);
    __cxa_throw(piVar6,&internal_error::typeinfo,internal_error::~internal_error);
  }
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  iVar4 = (*(*pptVar5)->_vptr_token_base[2])();
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  ptVar1 = *pptVar5;
  if (iVar4 == 0xf) {
    pp_Var8 = ptVar1[2]._vptr_token_base;
    pp_Var9 = ptVar1[3]._vptr_token_base;
    local_38 = ptVar1[3].line_num;
    pp_Var2 = ptVar1[4]._vptr_token_base;
    while (pp_Var8 != pp_Var2) {
      check_define_var(this,(tree_node *)*pp_Var8,regist,constant);
      pp_Var8 = pp_Var8 + 1;
      if (pp_Var8 == pp_Var9) {
        pp_Var8 = *(_func_int ***)(local_38 + 8);
        local_38 = local_38 + 8;
        pp_Var9 = pp_Var8 + 0x40;
      }
    }
  }
  else {
    if (ptVar1 == (token_base *)0x0) {
      piVar6 = (internal_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_60,"Null pointer accessed.",&local_61);
      internal_error::internal_error(piVar6,&local_60);
      __cxa_throw(piVar6,&internal_error::typeinfo,internal_error::~internal_error);
    }
    iVar4 = (*ptVar1->_vptr_token_base[2])(ptVar1);
    if (iVar4 != 3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_60,"Wrong grammar for variable definition(1).",&local_61);
      runtime_error::runtime_error(prVar7,&local_60);
      __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    if (*(int *)&ptVar1[1]._vptr_token_base != 0x35) {
      if (*(int *)&ptVar1[1]._vptr_token_base != 0x11) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_60,"Wrong grammar for variable definition(5).",&local_61);
        runtime_error::runtime_error(prVar7,&local_60);
        __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_60._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_60);
      ptVar1 = *pptVar5;
      local_60._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_60);
      if (((ptVar1 != (token_base *)0x0) && (ptVar3 = *pptVar5, ptVar3 != (token_base *)0x0)) &&
         (iVar4 = (*ptVar1->_vptr_token_base[2])(ptVar1), iVar4 == 4)) {
        if ((constant) && (iVar4 = (*ptVar3->_vptr_token_base[2])(ptVar3), iVar4 != 7)) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&local_60,"Wrong grammar for constant variable definition(3).",
                     &local_61);
          runtime_error::runtime_error(prVar7,&local_60);
          __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        if (!regist) {
          return;
        }
        domain_manager::add_record(&(this->super_runtime_type).storage,(string *)(ptVar1 + 3));
        return;
      }
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_60,"Wrong grammar for variable definition(2).",&local_61);
      runtime_error::runtime_error(prVar7,&local_60);
      __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_60._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_60);
    if ((constant) &&
       ((*pptVar5 == (token_base *)0x0 || (iVar4 = (*(*pptVar5)->_vptr_token_base[2])(), iVar4 != 7)
        ))) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_60,"Wrong grammar for constant variable definition(4).",&local_61)
      ;
      runtime_error::runtime_error(prVar7,&local_60);
      __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    it_00 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    check_define_structured_binding(this,it_00,regist);
  }
  return;
}

Assistant:

void instance_type::check_define_var(tree_type<token_base *>::iterator it, bool regist, bool constant)
	{
		if (it.data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				check_define_var(t.root(), regist, constant);
		}
		else {
			token_base *root = it.data();
			if (root == nullptr)
				throw internal_error("Null pointer accessed.");
			if (root->get_type() != token_types::signal)
				throw runtime_error("Wrong grammar for variable definition(1).");
			switch (static_cast<token_signal *>(root)->get_signal()) {
			case signal_types::asi_: {
				token_base *left = it.left().data();
				token_base *right = it.right().data();
				if (left == nullptr || right == nullptr || left->get_type() != token_types::id)
					throw runtime_error("Wrong grammar for variable definition(2).");
				if (constant && right->get_type() != token_types::value)
					throw runtime_error("Wrong grammar for constant variable definition(3).");
				if (regist)
					storage.add_record(static_cast<token_id *>(left)->get_id());
				break;
			}
			case signal_types::bind_: {
				token_base *right = it.right().data();
				if (constant && (right == nullptr || right->get_type() != token_types::value))
					throw runtime_error("Wrong grammar for constant variable definition(4).");
				check_define_structured_binding(it.left(), regist);
				break;
			}
			default:
				throw runtime_error("Wrong grammar for variable definition(5).");
			}
		}
	}